

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

void __thiscall
ScenePreprocessorTest_testAnimationPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testAnimationPreprocessingPos_Test *this)

{
  undefined8 *puVar1;
  aiNodeAnim *paVar2;
  bool bVar3;
  internal iVar4;
  aiAnimation *anim;
  aiVectorKey *paVar5;
  uint i;
  long lVar6;
  long lVar7;
  char *message;
  char *in_R9;
  float fVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper in_stack_ffffffffffffffa8;
  AssertHelper in_stack_ffffffffffffffb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  char in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  undefined1 local_28 [16];
  
  anim = MakeDummyAnimation();
  paVar2 = *anim->mChannels;
  paVar2->mNumScalingKeys = 10;
  paVar5 = (aiVectorKey *)operator_new__(0xf0);
  lVar6 = 0;
  do {
    puVar1 = (undefined8 *)((long)&paVar5->mTime + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(paVar5->mValue).z + lVar6) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xf0);
  paVar2->mScalingKeys = paVar5;
  lVar6 = 0;
  lVar7 = 0;
  do {
    fVar8 = (float)(int)lVar7;
    *(double *)((long)&paVar2->mScalingKeys->mTime + lVar6) = (double)(int)lVar7;
    paVar5 = paVar2->mScalingKeys;
    *(float *)((long)&(paVar5->mValue).x + lVar6) = fVar8;
    *(float *)((long)&(paVar5->mValue).y + lVar6) = fVar8;
    *(float *)((long)&(paVar5->mValue).z + lVar6) = fVar8;
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x18;
  } while (lVar7 != 10);
  Assimp::ScenePreprocessor::ProcessAnimation
            ((this->super_ScenePreprocessorTest).mScenePreprocessor,anim);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffb0.data_,(char *)in_stack_ffffffffffffffa8.data_,
             (char *)0x38e4e0,(double)in_stack_ffffffffffffffd0.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
             (double)in_stack_ffffffffffffffc0.ptr_);
  if (in_stack_ffffffffffffffc8 == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (in_stack_ffffffffffffffd0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((in_stack_ffffffffffffffd0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xbc,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffa8,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((((paVar2->mNumPositionKeys != 1) ||
       (paVar5 = paVar2->mPositionKeys, paVar5 == (aiVectorKey *)0x0)) || (paVar5->mTime != 0.0)) ||
     (((NAN(paVar5->mTime) || (fVar8 = (paVar5->mValue).x, fVar8 != 1.0)) ||
      ((NAN(fVar8) || ((fVar8 = (paVar5->mValue).y, fVar8 != 2.0 || (NAN(fVar8))))))))) {
    iVar4 = (internal)0x0;
  }
  else {
    iVar4 = (internal)(-((paVar5->mValue).z == 3.0) & 1);
  }
  local_48.ptr_._0_1_ = iVar4;
  if (iVar4 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffffc8,(internal *)&local_48,
               (AssertionResult *)
               "anim->mNumPositionKeys == 1 && anim->mPositionKeys && anim->mPositionKeys[0].mTime == 0.0 && anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xc2,(char *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    if ((undefined1 *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8) != local_28) {
      operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    }
    if (in_stack_ffffffffffffffa8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (in_stack_ffffffffffffffa8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffa8.data_ + 8))();
      }
      in_stack_ffffffffffffffa8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffc0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((paVar2->mNumRotationKeys == 1) && (paVar2->mRotationKeys != (aiQuatKey *)0x0)) {
    local_48.ptr_._0_1_ = (internal)(-(paVar2->mRotationKeys->mTime == 0.0) & 1);
  }
  else {
    local_48.ptr_._0_1_ = (internal)0x0;
  }
  if (local_48.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffffc8,(internal *)&local_48,
               (AssertionResult *)
               "anim->mNumRotationKeys == 1 && anim->mRotationKeys && anim->mRotationKeys[0].mTime == 0.0"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xc6,(char *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    if ((undefined1 *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8) != local_28) {
      operator_delete((undefined1 *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    }
    if (((in_stack_ffffffffffffffa8.data_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (in_stack_ffffffffffffffa8.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa8.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffc0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiAnimation::~aiAnimation(anim);
  operator_delete(anim);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testAnimationPreprocessingPos) {
    aiAnimation* p = MakeDummyAnimation();
    aiNodeAnim* anim = p->mChannels[0];

    // we don't set the animation duration, but generate scaling channels
    anim->mNumScalingKeys = 10;
    anim->mScalingKeys = new aiVectorKey[10];

    for (unsigned int i = 0; i < 10;++i)    {
        anim->mScalingKeys[i].mTime = i;
        anim->mScalingKeys[i].mValue = aiVector3D((float)i);
    }
    ProcessAnimation(p);

    // we should now have a proper duration
    EXPECT_NEAR(p->mDuration, 9., 0.005);

    // ... one scaling key
    EXPECT_TRUE(anim->mNumPositionKeys == 1 &&
        anim->mPositionKeys &&
        anim->mPositionKeys[0].mTime == 0.0 &&
        anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f));

    // ... and one rotation key
    EXPECT_TRUE(anim->mNumRotationKeys == 1 && anim->mRotationKeys &&
        anim->mRotationKeys[0].mTime == 0.0);

    delete p;
}